

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O3

void __thiscall
chrono::ChVariablesBodySharedMass::ArchiveOUT
          (ChVariablesBodySharedMass *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChSharedMassBody_*> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChVariablesBodySharedMass>(marchive);
  local_28._value = &this->sharedmass;
  local_28._name = "sharedmass";
  local_28._flags = '\0';
  ChArchiveOut::out<chrono::ChSharedMassBody>(marchive,&local_28);
  return;
}

Assistant:

void ChVariablesBodySharedMass::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChVariablesBodySharedMass>();
    // serialize parent class
    ChVariablesBody::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(sharedmass);
}